

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trip.c
# Opt level: O2

void read_trip(trip_t *record,int field_count,char **field_names,char **field_values)

{
  int iVar1;
  bikes_allowed_t bVar2;
  wheelchair_accessible_t wVar3;
  ulong uVar4;
  char *pcVar5;
  trip_t *__dest;
  ulong uVar6;
  ulong uVar7;
  
  init_trip(record);
  uVar6 = 0;
  uVar7 = (ulong)(uint)field_count;
  if (field_count < 1) {
    uVar7 = uVar6;
  }
  do {
    if (uVar7 == uVar6) {
      return;
    }
    pcVar5 = field_names[uVar6];
    iVar1 = strcmp(pcVar5,"route_id");
    if (iVar1 == 0) {
      pcVar5 = field_values[uVar6];
      __dest = record;
LAB_00105ed9:
      strcpy(__dest->route_id,pcVar5);
    }
    else {
      iVar1 = strcmp(pcVar5,"service_id");
      if (iVar1 == 0) {
        pcVar5 = field_values[uVar6];
        __dest = (trip_t *)record->service_id;
        goto LAB_00105ed9;
      }
      iVar1 = strcmp(pcVar5,"trip_id");
      if (iVar1 == 0) {
        pcVar5 = field_values[uVar6];
        __dest = (trip_t *)record->id;
        goto LAB_00105ed9;
      }
      iVar1 = strcmp(pcVar5,"trip_headsign");
      if (iVar1 == 0) {
        pcVar5 = field_values[uVar6];
        __dest = (trip_t *)record->headsign;
        goto LAB_00105ed9;
      }
      iVar1 = strcmp(pcVar5,"trip_short_name");
      if (iVar1 == 0) {
        pcVar5 = field_values[uVar6];
        __dest = (trip_t *)record->short_name;
        goto LAB_00105ed9;
      }
      iVar1 = strcmp(pcVar5,"direction_id");
      if (iVar1 != 0) {
        iVar1 = strcmp(pcVar5,"block_id");
        if (iVar1 == 0) {
          pcVar5 = field_values[uVar6];
          __dest = (trip_t *)record->block_id;
        }
        else {
          iVar1 = strcmp(pcVar5,"shape_id");
          if (iVar1 != 0) {
            iVar1 = strcmp(pcVar5,"wheelchair_accessible");
            if (iVar1 == 0) {
              wVar3 = parse_wheelchair_accessibility(field_values[uVar6]);
              record->wheelchair_accessible = wVar3;
            }
            else {
              iVar1 = strcmp(pcVar5,"bikes_allowed");
              if (iVar1 == 0) {
                bVar2 = parse_bike_allowance(field_values[uVar6]);
                record->bikes_allowed = bVar2;
              }
            }
            goto LAB_00105ede;
          }
          pcVar5 = field_values[uVar6];
          __dest = (trip_t *)record->shape_id;
        }
        goto LAB_00105ed9;
      }
      uVar4 = strtoul(field_values[uVar6],(char **)0x0,0);
      record->direction_id = (uint)uVar4;
    }
LAB_00105ede:
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void read_trip(trip_t *record, int field_count, const char **field_names, const char **field_values) {
    init_trip(record);

    for (int i = 0; i < field_count; i++) {
        if (strcmp(field_names[i], "route_id") == 0) {
            strcpy(record->route_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "service_id") == 0) {
            strcpy(record->service_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "trip_id") == 0) {
            strcpy(record->id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "trip_headsign") == 0) {
            strcpy(record->headsign, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "trip_short_name") == 0) {
            strcpy(record->short_name, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "direction_id") == 0) {
            record->direction_id = (unsigned int)strtoul(field_values[i], NULL, 0);
            continue;
        }
        if (strcmp(field_names[i], "block_id") == 0) {
            strcpy(record->block_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "shape_id") == 0) {
            strcpy(record->shape_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "wheelchair_accessible") == 0) {
            record->wheelchair_accessible = parse_wheelchair_accessibility(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "bikes_allowed") == 0) {
            record->bikes_allowed = parse_bike_allowance(field_values[i]);
            continue;
        }
    }
}